

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O0

void __thiscall
Rml::FontEffectBlur::GenerateGlyphTexture
          (FontEffectBlur *this,byte *destination_data,Vector2i destination_dimensions,
          int destination_stride,FontGlyph *glyph)

{
  byte *source;
  int destination_stride_00;
  uchar *puVar1;
  Vector2i local_90;
  Vector2i local_88;
  Vector2i local_80;
  Vector2i local_68;
  Vector2i local_60;
  Vector2i local_58;
  undefined1 local_50 [8];
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> x_output;
  int buf_size;
  int buf_stride;
  Vector2i buf_dimensions;
  FontGlyph *glyph_local;
  int destination_stride_local;
  byte *destination_data_local;
  FontEffectBlur *this_local;
  Vector2i destination_dimensions_local;
  
  buf_size = destination_dimensions.x;
  x_output.p._4_4_ = buf_size;
  buf_stride = destination_dimensions.y;
  x_output.p._0_4_ = buf_size * buf_stride;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)local_50,
             (long)(int)x_output.p);
  puVar1 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                     ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                      local_50);
  destination_stride_00 = x_output.p._4_4_;
  source = glyph->bitmap_data;
  local_60 = glyph->bitmap_dimensions;
  local_58 = destination_dimensions;
  Vector2<int>::Vector2(&local_68,this->width);
  ConvolutionFilter::Run
            (&this->filter_x,puVar1,local_58,destination_stride_00,A8,source,local_60,local_68,
             glyph->color_format);
  local_80 = destination_dimensions;
  puVar1 = DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::data
                     ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)
                      local_50);
  local_88 = destination_dimensions;
  Vector2<int>::Vector2(&local_90,0);
  ConvolutionFilter::Run
            (&this->filter_y,destination_data,local_80,destination_stride,RGBA8,puVar1,local_88,
             local_90,A8);
  FontEffect::FillColorValuesFromAlpha(destination_data,destination_dimensions,destination_stride);
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_>::~DynamicArray
            ((DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> *)local_50);
  return;
}

Assistant:

void FontEffectBlur::GenerateGlyphTexture(byte* destination_data, const Vector2i destination_dimensions, int destination_stride,
	const FontGlyph& glyph) const
{
	const Vector2i buf_dimensions = destination_dimensions;
	const int buf_stride = buf_dimensions.x;
	const int buf_size = buf_dimensions.x * buf_dimensions.y;
	DynamicArray<byte, GlobalStackAllocator<byte>> x_output(buf_size);

	filter_x.Run(x_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, glyph.bitmap_data, glyph.bitmap_dimensions, Vector2i(width),
		glyph.color_format);

	filter_y.Run(destination_data, destination_dimensions, destination_stride, ColorFormat::RGBA8, x_output.data(), buf_dimensions, Vector2i(0),
		ColorFormat::A8);

	FillColorValuesFromAlpha(destination_data, destination_dimensions, destination_stride);
}